

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_Mmap(char *zPath,void **ppMap,jx9_int64 *pSize)

{
  int __fd;
  void *pvVar1;
  int local_c8;
  int rc;
  int fd;
  void *pMap;
  stat st;
  jx9_int64 *pSize_local;
  void **ppMap_local;
  char *zPath_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)pSize;
  __fd = open(zPath,0);
  if (__fd < 0) {
    zPath_local._4_4_ = -1;
  }
  else {
    fstat(__fd,(stat *)&pMap);
    pvVar1 = mmap((void *)0x0,st.st_rdev,1,2,__fd,0);
    local_c8 = 0;
    if (pvVar1 == (void *)0xffffffffffffffff) {
      local_c8 = -1;
    }
    else {
      *ppMap = pvVar1;
      *(__dev_t *)st.__glibc_reserved[2] = st.st_rdev;
    }
    close(__fd);
    zPath_local._4_4_ = local_c8;
  }
  return zPath_local._4_4_;
}

Assistant:

static int UnixVfs_Mmap(const char *zPath, void **ppMap, jx9_int64 *pSize)
{
	struct stat st;
	void *pMap;
	int fd;
	int rc;
	/* Open the file in a read-only mode */
	fd = open(zPath, O_RDONLY);
	if( fd < 0 ){
		return -1;
	}
	/* stat the handle */
	fstat(fd, &st);
	/* Obtain a memory view of the whole file */
	pMap = mmap(0, st.st_size, PROT_READ, MAP_PRIVATE|MAP_FILE, fd, 0);
	rc = JX9_OK;
	if( pMap == MAP_FAILED ){
		rc = -1;
	}else{
		/* Point to the memory view */
		*ppMap = pMap;
		*pSize = (jx9_int64)st.st_size;
	}
	close(fd);
	return rc;
}